

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADAFWTextureCoordinateBinding.h
# Opt level: O1

void __thiscall
COLLADAFW::TextureCoordinateBinding::~TextureCoordinateBinding(TextureCoordinateBinding *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  this->_vptr_TextureCoordinateBinding = (_func_int **)&PTR__TextureCoordinateBinding_009dc158;
  pcVar2 = (this->mSemantic)._M_dataplus._M_p;
  paVar1 = &(this->mSemantic).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  operator_delete(this,0x38);
  return;
}

Assistant:

virtual ~TextureCoordinateBinding() {}